

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O1

int __thiscall geemuboi::core::CPU::cp_mhl(CPU *this)

{
  byte bVar1;
  ushort uVar2;
  Registers *pRVar3;
  int iVar4;
  byte bVar5;
  
  uVar2._0_1_ = this->regs->h;
  uVar2._1_1_ = this->regs->l;
  iVar4 = (**this->mmu->_vptr_IMmu)(this->mmu,(ulong)(ushort)(uVar2 << 8 | uVar2 >> 8));
  pRVar3 = this->regs;
  bVar1 = pRVar3->a;
  bVar5 = (byte)iVar4;
  pRVar3->f = (bVar1 < bVar5) << 4 | ((bVar1 & 0xf) < (bVar5 & 0xf)) << 5 | 0x40;
  if (bVar1 == bVar5) {
    pRVar3->f = pRVar3->f | 0x80;
  }
  return 2;
}

Assistant:

int CPU::cp_mhl() {
    uint16_t addr = (regs.h << 8) + regs.l;
    cp_r8(mmu.read_byte(addr));
    return 2;
}